

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testJacobiTiming<double>(void)

{
  clock_t cVar1;
  ostream *poVar2;
  double dVar3;
  int i_3;
  int i_2;
  Vec4<double> S_1;
  Matrix44<double> U_1;
  Matrix44<double> V_1;
  Matrix44<double> A_1;
  int i_1;
  int i;
  Vec3<double> S;
  Matrix33<double> U;
  Matrix33<double> V;
  Matrix33<double> A;
  clock_t t;
  clock_t tSVD;
  clock_t tJacobi;
  int rounds;
  Matrix44<double> *in_stack_fffffffffffffa20;
  Vec4<double> *in_stack_fffffffffffffa28;
  Matrix44<double> *in_stack_fffffffffffffa30;
  Matrix44<double> local_570;
  int local_4ec;
  Matrix44<double> local_4e8;
  Matrix44<double> local_468;
  int local_3e4;
  Vec4<double> local_3e0;
  Matrix44<double> local_3c0;
  Matrix44<double> local_340;
  Matrix44<double> local_2c0;
  Matrix33<double> local_240;
  Matrix33<double> local_1f8;
  int local_1ac;
  Matrix33<double> local_1a8;
  Matrix33<double> local_160;
  int local_114;
  Vec3<double> local_110;
  Matrix33<double> local_f8;
  Matrix33<double> local_b0;
  Matrix33<double> local_68;
  clock_t local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_4 = 100000;
  Imath_3_2::Matrix33<double>::Matrix33(&local_68);
  Imath_3_2::Matrix33<double>::Matrix33(&local_b0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_f8);
  Imath_3_2::Vec3<double>::Vec3(&local_110);
  local_20 = clock();
  for (local_114 = 0; local_114 < local_4; local_114 = local_114 + 1) {
    Imath_3_2::Matrix33<double>::Matrix33(&local_160,&A33_7);
    Imath_3_2::Matrix33<double>::operator=(&local_68,&local_160);
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix33<double> *)in_stack_fffffffffffffa30,
               (Vec3<double> *)in_stack_fffffffffffffa28,
               (Matrix33<double> *)in_stack_fffffffffffffa20);
    Imath_3_2::Matrix33<double>::Matrix33(&local_1a8,&A33_8);
    Imath_3_2::Matrix33<double>::operator=(&local_68,&local_1a8);
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix33<double> *)in_stack_fffffffffffffa30,
               (Vec3<double> *)in_stack_fffffffffffffa28,
               (Matrix33<double> *)in_stack_fffffffffffffa20);
  }
  cVar1 = clock();
  local_10 = cVar1 - local_20;
  poVar2 = std::operator<<((ostream *)&std::cout,"Jacobi EigenSolver of 3x3 matrices took ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  poVar2 = std::operator<<(poVar2," clocks.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_20 = clock();
  for (local_1ac = 0; local_1ac < local_4; local_1ac = local_1ac + 1) {
    Imath_3_2::Matrix33<double>::Matrix33(&local_1f8,&A33_7);
    Imath_3_2::Matrix33<double>::operator=(&local_68,&local_1f8);
    dVar3 = std::numeric_limits<double>::epsilon();
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)&local_68,(Matrix33 *)&local_f8,(Vec3 *)&local_110,(Matrix33 *)&local_b0,
               dVar3,false);
    Imath_3_2::Matrix33<double>::Matrix33(&local_240,&A33_8);
    Imath_3_2::Matrix33<double>::operator=(&local_68,&local_240);
    dVar3 = std::numeric_limits<double>::epsilon();
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)&local_68,(Matrix33 *)&local_f8,(Vec3 *)&local_110,(Matrix33 *)&local_b0,
               dVar3,false);
  }
  cVar1 = clock();
  local_18 = cVar1 - local_20;
  poVar2 = std::operator<<((ostream *)&std::cout,"TinySVD            of 3x3 matrices took ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2," clocks.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,((float)(local_18 - local_10) * 100.0) / (float)local_18);
  poVar2 = std::operator<<(poVar2,"% speed up.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Matrix44<double>::Matrix44(&local_2c0);
  Imath_3_2::Matrix44<double>::Matrix44(&local_340);
  Imath_3_2::Matrix44<double>::Matrix44(&local_3c0);
  Imath_3_2::Vec4<double>::Vec4(&local_3e0);
  local_20 = clock();
  for (local_3e4 = 0; local_3e4 < local_4; local_3e4 = local_3e4 + 1) {
    Imath_3_2::Matrix44<double>::Matrix44(&local_468,&A44_7);
    Imath_3_2::Matrix44<double>::operator=(&local_2c0,&local_468);
    Imath_3_2::jacobiEigenSolver<double>
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    Imath_3_2::Matrix44<double>::Matrix44(&local_4e8,&A44_8);
    Imath_3_2::Matrix44<double>::operator=(&local_2c0,&local_4e8);
    Imath_3_2::jacobiEigenSolver<double>
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  }
  cVar1 = clock();
  local_10 = cVar1 - local_20;
  poVar2 = std::operator<<((ostream *)&std::cout,"Jacobi EigenSolver of 4x4 matrices took ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  poVar2 = std::operator<<(poVar2," clocks");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_20 = clock();
  for (local_4ec = 0; local_4ec < local_4; local_4ec = local_4ec + 1) {
    Imath_3_2::Matrix44<double>::Matrix44(&local_570,&A44_7);
    Imath_3_2::Matrix44<double>::operator=(&local_2c0,&local_570);
    dVar3 = std::numeric_limits<double>::epsilon();
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)&local_2c0,(Matrix44 *)&local_3c0,(Vec4 *)&local_3e0,
               (Matrix44 *)&local_340,dVar3,false);
    Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)&stack0xfffffffffffffa10,&A44_8);
    Imath_3_2::Matrix44<double>::operator=(&local_2c0,(Matrix44<double> *)&stack0xfffffffffffffa10);
    dVar3 = std::numeric_limits<double>::epsilon();
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)&local_2c0,(Matrix44 *)&local_3c0,(Vec4 *)&local_3e0,
               (Matrix44 *)&local_340,dVar3,false);
  }
  cVar1 = clock();
  local_18 = cVar1 - local_20;
  poVar2 = std::operator<<((ostream *)&std::cout,"TinySVD            of 4x4 matrices took ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2," clocks");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,((float)(local_18 - local_10) * 100.0) / (float)local_18);
  poVar2 = std::operator<<(poVar2,"% speed up.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testJacobiTiming ()
{

    int     rounds (100000);
    clock_t tJacobi, tSVD, t;

    {
        Matrix33<T> A, V, U;
        Vec3<T>     S;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix33<T> (A33_7);
            jacobiEigenSolver (A, S, V);
            A = Matrix33<T> (A33_8);
            jacobiEigenSolver (A, S, V);
        }
        tJacobi = clock () - t;
        cout << "Jacobi EigenSolver of 3x3 matrices took " << tJacobi
             << " clocks." << endl;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix33<T> (A33_7);
            jacobiSVD (A, U, S, V);
            A = Matrix33<T> (A33_8);
            jacobiSVD (A, U, S, V);
        }
        tSVD = clock () - t;
        cout << "TinySVD            of 3x3 matrices took " << tSVD << " clocks."
             << endl;
        cout << (float) (tSVD - tJacobi) * 100.0f / (float) (tSVD)
             << "% speed up." << endl;
    }

    {
        Matrix44<T> A, V, U;
        Vec4<T>     S;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix44<T> (A44_7);
            jacobiEigenSolver (A, S, V);
            A = Matrix44<T> (A44_8);
            jacobiEigenSolver (A, S, V);
        }
        tJacobi = clock () - t;
        cout << "Jacobi EigenSolver of 4x4 matrices took " << tJacobi
             << " clocks" << endl;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix44<T> (A44_7);
            jacobiSVD (A, U, S, V);
            A = Matrix44<T> (A44_8);
            jacobiSVD (A, U, S, V);
        }
        tSVD = clock () - t;
        cout << "TinySVD            of 4x4 matrices took " << tSVD << " clocks"
             << endl;
        cout << (float) (tSVD - tJacobi) * 100.0f / (float) (tSVD)
             << "% speed up." << endl;
    }
}